

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
SettingToString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,SettingsValue *value)

{
  long lVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (value->typ == VNULL) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_002be9c4;
  }
  else {
    bVar2 = UniValue::isFalse(value);
    if (bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_002be9c4;
      pcVar4 = "0";
    }
    else {
      bVar2 = UniValue::isTrue(value);
      if (!bVar2) {
        if (value->typ == VNUM) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            psVar3 = &value->val;
LAB_002be9b4:
            std::_Optional_payload_base<std::__cxx11::string>::
            _Optional_payload_base<std::__cxx11::string_const&>
                      ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,psVar3
                      );
            return __return_storage_ptr__;
          }
        }
        else {
          psVar3 = UniValue::get_str_abi_cxx11_(value);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) goto LAB_002be9b4;
        }
LAB_002be9c4:
        __stack_chk_fail();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_002be9c4;
      pcVar4 = "1";
    }
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[2]>
              ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> SettingToString(const common::SettingsValue& value)
{
    if (value.isNull()) return std::nullopt;
    if (value.isFalse()) return "0";
    if (value.isTrue()) return "1";
    if (value.isNum()) return value.getValStr();
    return value.get_str();
}